

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpmessageunit.c
# Opt level: O0

int main(int argc,char **argv)

{
  unsigned_long test_long;
  uint test_int;
  size_t test_size;
  yabmp l_instance;
  int result;
  char **argv_local;
  int argc_local;
  
  l_instance.rle_skip_y = 0;
  memset(&test_size,0,0x420);
  l_instance.message_context = print_error;
  l_instance.error_fn = print_warning;
  yabmp_send_warning((yabmp *)&test_size,"test yabmp_vsnprintf %%");
  yabmp_send_error((yabmp *)&test_size,"test yabmp_vsnprintf %s","string");
  yabmp_send_error((yabmp *)&test_size,"test yabmp_vsnprintf %s",0);
  yabmp_send_error((yabmp *)&test_size,"test yabmp_vsnprintf %zu",0);
  yabmp_send_error((yabmp *)&test_size,"test yabmp_vsnprintf %u",0);
  yabmp_send_error((yabmp *)&test_size,"test yabmp_vsnprintf %lu",0);
  return l_instance.rle_skip_y;
}

Assistant:

int main(int argc, char* argv[])
{
	int result = EXIT_SUCCESS;
	
	yabmp l_instance = {0};
	
	l_instance.error_fn = print_error;
	l_instance.warning_fn = print_warning;
	
	/* test messages */
	{
		size_t test_size = 0U;
		unsigned int test_int = 0U;
		unsigned long test_long = 0U;
		yabmp_send_warning(&l_instance, "test yabmp_vsnprintf %%");
		yabmp_send_error(&l_instance, "test yabmp_vsnprintf %s", "string");
		yabmp_send_error(&l_instance, "test yabmp_vsnprintf %s", NULL);
		yabmp_send_error(&l_instance, "test yabmp_vsnprintf %zu", test_size);
		yabmp_send_error(&l_instance, "test yabmp_vsnprintf %u", test_int);
		yabmp_send_error(&l_instance, "test yabmp_vsnprintf %lu", test_long);
	}
	
	return result;
	
}